

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SpotLight * __thiscall
embree::SceneGraph::SpotLight::transform(SpotLight *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  SpotLight *in_RDI;
  
  fVar1 = (this->P).field_0.m128[0];
  fVar2 = (this->P).field_0.m128[1];
  fVar3 = (this->P).field_0.m128[2];
  fVar4 = (space->l).vx.field_0.m128[0];
  fVar5 = (space->l).vx.field_0.m128[1];
  fVar6 = (space->l).vx.field_0.m128[2];
  fVar7 = (space->l).vx.field_0.m128[3];
  fVar8 = (space->l).vz.field_0.m128[0];
  fVar9 = (space->l).vz.field_0.m128[1];
  fVar10 = (space->l).vz.field_0.m128[2];
  fVar11 = (space->l).vz.field_0.m128[3];
  fVar12 = (space->p).field_0.m128[0];
  fVar13 = (space->p).field_0.m128[1];
  fVar14 = (space->p).field_0.m128[2];
  fVar15 = (space->p).field_0.m128[3];
  fVar16 = (space->l).vy.field_0.m128[0];
  fVar17 = (space->l).vy.field_0.m128[1];
  fVar18 = (space->l).vy.field_0.m128[2];
  fVar19 = (space->l).vy.field_0.m128[3];
  fVar20 = (this->D).field_0.m128[0];
  fVar21 = (this->D).field_0.m128[1];
  fVar22 = (this->D).field_0.m128[2];
  (in_RDI->super_Light).type = LIGHT_SPOT;
  (in_RDI->P).field_0.m128[0] = fVar1 * fVar4 + fVar2 * fVar16 + fVar3 * fVar8 + fVar12;
  (in_RDI->P).field_0.m128[1] = fVar1 * fVar5 + fVar2 * fVar17 + fVar3 * fVar9 + fVar13;
  (in_RDI->P).field_0.m128[2] = fVar1 * fVar6 + fVar2 * fVar18 + fVar3 * fVar10 + fVar14;
  (in_RDI->P).field_0.m128[3] = fVar1 * fVar7 + fVar2 * fVar19 + fVar3 * fVar11 + fVar15;
  (in_RDI->D).field_0.m128[0] = fVar20 * fVar4 + fVar21 * fVar16 + fVar22 * fVar8;
  (in_RDI->D).field_0.m128[1] = fVar20 * fVar5 + fVar21 * fVar17 + fVar22 * fVar9;
  (in_RDI->D).field_0.m128[2] = fVar20 * fVar6 + fVar21 * fVar18 + fVar22 * fVar10;
  (in_RDI->D).field_0.m128[3] = fVar20 * fVar7 + fVar21 * fVar19 + fVar22 * fVar11;
  uVar23 = *(undefined8 *)((long)&(this->I).field_0 + 8);
  *(undefined8 *)&(in_RDI->I).field_0 = *(undefined8 *)&(this->I).field_0;
  *(undefined8 *)((long)&(in_RDI->I).field_0 + 8) = uVar23;
  fVar1 = this->angleMax;
  in_RDI->angleMin = this->angleMin;
  in_RDI->angleMax = fVar1;
  return in_RDI;
}

Assistant:

SpotLight transform(const AffineSpace3fa& space) const {
        return SpotLight(xfmPoint(space,P),xfmVector(space,D),I,angleMin,angleMax);
      }